

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O3

void __thiscall
fasttext::Dictionary::addWordNgrams
          (Dictionary *this,vector<int,_std::allocator<int>_> *line,
          vector<int,_std::allocator<int>_> *hashes,int32_t n)

{
  ulong uVar1;
  pointer piVar2;
  pointer piVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  
  piVar2 = (hashes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar3 = (hashes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (piVar3 != piVar2) {
    uVar10 = 2;
    lVar6 = 0x200000000;
    uVar5 = 0;
    do {
      uVar1 = uVar5 + 1;
      uVar4 = (long)piVar3 - (long)piVar2 >> 2;
      if (uVar1 < uVar4 && 1 < n) {
        uVar9 = (ulong)piVar2[uVar5];
        lVar7 = lVar6;
        uVar11 = uVar10;
        do {
          uVar9 = (long)piVar2[uVar11 - 1] + uVar9 * 0x6eac5db;
          pushHash(this,line,
                   (int32_t)(uVar9 % (ulong)(long)((this->args_).
                                                                                                      
                                                  super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->bucket));
          piVar2 = (hashes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          piVar3 = (hashes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          uVar4 = (long)piVar3 - (long)piVar2 >> 2;
          if (uVar4 <= uVar11) break;
          lVar8 = lVar7 >> 0x20;
          uVar11 = uVar11 + 1;
          lVar7 = lVar7 + 0x100000000;
        } while (lVar8 < (long)(uVar5 + (long)n));
      }
      uVar10 = uVar10 + 1;
      lVar6 = lVar6 + 0x100000000;
      uVar5 = uVar1;
    } while (uVar1 < uVar4);
  }
  return;
}

Assistant:

void Dictionary::addWordNgrams(std::vector<int32_t>& line,
                               const std::vector<int32_t>& hashes,
                               int32_t n) const {
  for (int32_t i = 0; i < hashes.size(); i++) {
    uint64_t h = hashes[i];
    for (int32_t j = i + 1; j < hashes.size() && j < i + n; j++) {
      h = h * 116049371 + hashes[j];
      pushHash(line, h % args_->bucket);
    }
  }
}